

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,Track *pTrack,longlong time_ns)

{
  bool bVar1;
  int iVar2;
  BlockEntry *pBVar3;
  long lVar4;
  undefined4 extraout_var;
  longlong lVar5;
  ulong uVar6;
  longlong ns_1;
  longlong ns;
  Block *pBlock;
  BlockEntry *pEntry;
  long status;
  long len;
  longlong pos;
  long index;
  BlockEntry *pResult;
  longlong time_ns_local;
  Track *pTrack_local;
  Cluster *this_local;
  Block *this_00;
  
  pResult = (BlockEntry *)time_ns;
  time_ns_local = (longlong)pTrack;
  pTrack_local = (Track *)this;
  if (pTrack == (Track *)0x0) {
    __assert_fail("pTrack",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1cfd,
                  "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const");
  }
  if (this->m_pSegment == (Segment *)0x0) {
    pBVar3 = Track::GetEOS(pTrack);
    return pBVar3;
  }
  index = (long)Track::GetEOS(pTrack);
  pos = 0;
  do {
    if (this->m_entries_count <= pos) {
      lVar4 = Parse(this,&len,&status);
      if (lVar4 < 0) {
        __assert_fail("status >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d0c,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                     );
      }
      if (0 < lVar4) {
        return (BlockEntry *)index;
      }
      if (lVar4 < 0) {
        return (BlockEntry *)0x0;
      }
      if (this->m_entries == (BlockEntry **)0x0) {
        __assert_fail("m_entries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d14,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                     );
      }
      if (this->m_entries_count <= pos) {
        __assert_fail("index < m_entries_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d15,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                     );
      }
    }
    pBVar3 = this->m_entries[pos];
    if (pBVar3 == (BlockEntry *)0x0) {
      __assert_fail("pEntry",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d19,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                   );
    }
    bVar1 = BlockEntry::EOS(pBVar3);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!pEntry->EOS()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d1a,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                   );
    }
    iVar2 = (*pBVar3->_vptr_BlockEntry[2])();
    this_00 = (Block *)CONCAT44(extraout_var,iVar2);
    if (this_00 == (Block *)0x0) {
      __assert_fail("pBlock",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d1d,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const Track *, long long) const"
                   );
    }
    lVar5 = Block::GetTrackNumber(this_00);
    lVar4 = Track::GetNumber((Track *)time_ns_local);
    if (lVar5 == lVar4) {
      uVar6 = (**(code **)(*(long *)time_ns_local + 0x10))(time_ns_local,pBVar3);
      if ((uVar6 & 1) == 0) {
        pBVar3 = (BlockEntry *)index;
        if ((-1 < (long)pResult) &&
           (lVar5 = Block::GetTime(this_00,this), pBVar3 = (BlockEntry *)index,
           (long)pResult < lVar5)) {
          return (BlockEntry *)index;
        }
      }
      else {
        if ((long)pResult < 0) {
          return pBVar3;
        }
        lVar5 = Block::GetTime(this_00,this);
        if ((long)pResult < lVar5) {
          return (BlockEntry *)index;
        }
      }
      index = (long)pBVar3;
      pos = pos + 1;
    }
    else {
      pos = pos + 1;
    }
  } while( true );
}

Assistant:

const BlockEntry* Cluster::GetEntry(const Track* pTrack,
                                    long long time_ns) const {
  assert(pTrack);

  if (m_pSegment == NULL)  // this is the special EOS cluster
    return pTrack->GetEOS();

  const BlockEntry* pResult = pTrack->GetEOS();

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);
      assert(status >= 0);

      if (status > 0)  // completely parsed, and no more entries
        return pResult;

      if (status < 0)  // should never happen
        return 0;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != pTrack->GetNumber()) {
      ++index;
      continue;
    }

    if (pTrack->VetEntry(pEntry)) {
      if (time_ns < 0)  // just want first candidate block
        return pEntry;

      const long long ns = pBlock->GetTime(this);

      if (ns > time_ns)
        return pResult;

      pResult = pEntry;  // have a candidate
    } else if (time_ns >= 0) {
      const long long ns = pBlock->GetTime(this);

      if (ns > time_ns)
        return pResult;
    }

    ++index;
  }
}